

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_quaternion rf_quaternion_mul(rf_quaternion q1,rf_quaternion q2)

{
  rf_quaternion rVar1;
  float qbw;
  float qbz;
  float qby;
  float qbx;
  float qaw;
  float qaz;
  float qay;
  float qax;
  rf_quaternion q2_local;
  rf_quaternion q1_local;
  rf_quaternion result;
  
  q2_local.z = q1.x;
  q2_local.w = q1.y;
  q1_local.x = q1.z;
  q1_local.y = q1.w;
  qay = q2.x;
  qax = q2.y;
  q2_local.x = q2.z;
  q2_local.y = q2.w;
  rVar1.y = (q1_local.x * qay + q2_local.w * q2_local.y + q1_local.y * qax) -
            q2_local.z * q2_local.x;
  rVar1.x = (q2_local.w * q2_local.x + q2_local.z * q2_local.y + q1_local.y * qay) -
            q1_local.x * qax;
  rVar1.z = (q2_local.z * qax + q1_local.x * q2_local.y + q1_local.y * q2_local.x) -
            q2_local.w * qay;
  rVar1.w = ((q1_local.y * q2_local.y - q2_local.z * qay) - q2_local.w * qax) -
            q1_local.x * q2_local.x;
  return rVar1;
}

Assistant:

RF_API rf_quaternion rf_quaternion_mul(rf_quaternion q1, rf_quaternion q2)
{
    rf_quaternion result = {0};

    float qax = q1.x, qay = q1.y, qaz = q1.z, qaw = q1.w;
    float qbx = q2.x, qby = q2.y, qbz = q2.z, qbw = q2.w;

    result.x = qax * qbw + qaw * qbx + qay * qbz - qaz * qby;
    result.y = qay * qbw + qaw * qby + qaz * qbx - qax * qbz;
    result.z = qaz * qbw + qaw * qbz + qax * qby - qay * qbx;
    result.w = qaw * qbw - qax * qbx - qay * qby - qaz * qbz;

    return result;
}